

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)

{
  lhpage *pMaster;
  sxu16 *psVar1;
  lhash_kv_engine *pEngine;
  int iVar2;
  lhpage *pPage_00;
  sxu16 nByte;
  uint uVar3;
  int iVar4;
  lhpage *plVar5;
  sxu16 iOfft;
  uint local_5c;
  lhpage **local_58;
  sxu16 *local_50;
  sxu64 local_48;
  lhash_kv_engine *local_40;
  unqlite_page *pRaw;
  
  local_40 = pPage->pHash;
  pMaster = pPage->pMaster;
  pPage_00 = pMaster->pSlave;
  local_5c = (int)nAmount + 0x1a;
  uVar3 = local_5c & 0xffff;
  local_58 = ppSlave;
  local_50 = pOfft;
  local_48 = nAmount;
  for (iVar4 = 0; pEngine = local_40, iVar4 < pMaster->iSlave; iVar4 = iVar4 + 1) {
    iVar2 = lhAllocateSpace(pPage_00,(ulong)uVar3,&iOfft);
    if (iVar2 == 0) {
      nByte = (sxu16)local_5c;
LAB_001137d8:
      if (local_50 == (sxu16 *)0x0) {
        lhRestoreSpace(pPage_00,iOfft,nByte);
      }
      else {
        *local_50 = iOfft;
      }
      goto LAB_001137fa;
    }
    iVar2 = lhAllocateSpace(pPage_00,0x1a,&iOfft);
    if (iVar2 == 0) {
      nByte = 0x1a;
      goto LAB_001137d8;
    }
    pPage_00 = pPage_00->pNextSlave;
  }
  iVar4 = lhAcquirePage(local_40,&pRaw);
  if (iVar4 == 0) {
    plVar5 = pMaster->pSlave;
    if (pMaster->pSlave == (lhpage *)0x0) {
      plVar5 = pMaster;
    }
    pPage_00 = lhNewPage(pEngine,pRaw,pMaster);
    if (pPage_00 == (lhpage *)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = lhSetEmptyPage(pPage_00);
      psVar1 = local_50;
      if (iVar4 == 0) {
        if (local_50 != (sxu16 *)0x0) {
          iVar4 = lhAllocateSpace(pPage_00,local_48 + 0x1a,&iOfft);
          if (iVar4 != 0) {
            lhAllocateSpace(pPage_00,0x1a,&iOfft);
          }
          *psVar1 = iOfft;
        }
        iVar4 = (*pEngine->pIo->xWrite)(plVar5->pRaw);
        if (iVar4 == 0) {
          SyBigEndianPack64(plVar5->pRaw->zData + 4,pRaw->iPage);
          (plVar5->sHdr).iSlave = pRaw->iPage;
LAB_001137fa:
          *local_58 = pPage_00;
          return 0;
        }
      }
      (*pEngine->pIo->xPageUnref)(pPage_00->pRaw);
    }
  }
  return iVar4;
}

Assistant:

static int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	lhpage *pMaster = pPage->pMaster;
	lhpage *pSlave = pMaster->pSlave;
	unqlite_page *pRaw;
	lhpage *pNew;
	sxu16 iOfft;
	sxi32 i;
	int rc;
	/* Look for an already attached slave page */
	for( i = 0 ; i < pMaster->iSlave ; ++i ){
		/* Find a free chunk big enough */
		sxu16 size = (sxu16)(L_HASH_CELL_SZ + nAmount);
		rc = lhAllocateSpace(pSlave,size,&iOfft);
		if( rc != UNQLITE_OK ){
			/* A space for cell header only */
			size = L_HASH_CELL_SZ;
			rc = lhAllocateSpace(pSlave,size,&iOfft);
		}
		if( rc == UNQLITE_OK ){
			/* All done */
			if( pOfft ){
				*pOfft = iOfft;
			}else{
				rc = lhRestoreSpace(pSlave, iOfft, size);
			}
			*ppSlave = pSlave;
			return rc;
		}
		/* Point to the next slave page */
		pSlave = pSlave->pNextSlave;
	}
	/* Acquire a new slave page */
	rc = lhAcquirePage(pEngine,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Last slave page */
	pSlave = pMaster->pSlave;
	if( pSlave == 0 ){
		/* First slave page */
		pSlave = pMaster;
	}
	/* Initialize the page */
	pNew = lhNewPage(pEngine,pRaw,pMaster);
	if( pNew == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Mark as an empty page */
	rc = lhSetEmptyPage(pNew);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	if( pOfft ){
		/* Look for a free block */
		if( UNQLITE_OK != lhAllocateSpace(pNew,L_HASH_CELL_SZ+nAmount,&iOfft) ){
			/* Cell header only */
			lhAllocateSpace(pNew,L_HASH_CELL_SZ,&iOfft); /* Never fail */
		}	
		*pOfft = iOfft;
	}
	/* Link this page to the previous slave page */
	rc = pEngine->pIo->xWrite(pSlave->pRaw);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Reflect in the page header */
	SyBigEndianPack64(&pSlave->pRaw->zData[2/*Cell offset*/+2/*Free block offset*/],pRaw->iPage);
	pSlave->sHdr.iSlave = pRaw->iPage;
	/* All done */
	*ppSlave = pNew;
	return UNQLITE_OK;
fail:
	pEngine->pIo->xPageUnref(pNew->pRaw); /* pNew will be released in this call */
	return rc;

}